

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL Js::JavascriptOperators::OP_SetNativeIntElementI
               (Var instance,Var aElementIndex,int32 iValue,ScriptContext *scriptContext,
               PropertyOperationFlags flags)

{
  bool bVar1;
  uint32 indexInt_00;
  BOOL BVar2;
  INT_PTR IVar3;
  JavascriptArray *this;
  long lVar4;
  JavascriptNativeIntArray *arr;
  int32 indexInt;
  INT_PTR vt;
  PropertyOperationFlags flags_local;
  ScriptContext *scriptContext_local;
  int32 iValue_local;
  Var aElementIndex_local;
  Var instance_local;
  Var local_10;
  
  IVar3 = VirtualTableInfoBase::GetVirtualTable(instance);
  bVar1 = TaggedInt::Is(aElementIndex);
  if (((bVar1) && (indexInt_00 = TaggedInt::ToInt32(aElementIndex), -1 < (int)indexInt_00)) &&
     (bVar1 = ScriptContextOptimizationOverrideInfo::IsEnabledArraySetElementFastPath
                        (&scriptContext->optimizationOverrides), bVar1)) {
    this = (JavascriptArray *)VarTo<Js::JavascriptNativeIntArray>(instance);
    BVar2 = Js::JavascriptArray::TryGrowHeadSegmentAndSetItem<int,Js::JavascriptNativeIntArray>
                      (this,indexInt_00,iValue);
    if (BVar2 == 0) {
      JavascriptNativeIntArray::SetItem((JavascriptNativeIntArray *)this,indexInt_00,iValue);
    }
    lVar4 = VirtualTableInfoBase::GetVirtualTable(instance);
  }
  else {
    bVar1 = TaggedInt::IsOverflow(iValue);
    if (bVar1) {
      local_10 = JavascriptNumber::NewInlined((double)iValue,scriptContext);
    }
    else {
      local_10 = TaggedInt::ToVarUnchecked(iValue);
    }
    OP_SetElementI(instance,aElementIndex,local_10,scriptContext,flags);
    lVar4 = VirtualTableInfoBase::GetVirtualTable(instance);
  }
  instance_local._4_4_ = (uint)(IVar3 != lVar4);
  return instance_local._4_4_;
}

Assistant:

BOOL JavascriptOperators::OP_SetNativeIntElementI(
        Var instance,
        Var aElementIndex,
        int32 iValue,
        ScriptContext* scriptContext,
        PropertyOperationFlags flags)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_SetNativeIntElementI);

        INT_PTR vt = (INT_PTR)nullptr;
        vt = VirtualTableInfoBase::GetVirtualTable(instance);

        if (TaggedInt::Is(aElementIndex))
        {
            int32 indexInt = TaggedInt::ToInt32(aElementIndex);
            if (indexInt >= 0 && scriptContext->optimizationOverrides.IsEnabledArraySetElementFastPath())
            {
                JavascriptNativeIntArray *arr = VarTo<JavascriptNativeIntArray>(instance);
                if (!(arr->TryGrowHeadSegmentAndSetItem<int32, JavascriptNativeIntArray>((uint32)indexInt, iValue)))
                {
                    arr->SetItem(indexInt, iValue);
                }
                return vt != VirtualTableInfoBase::GetVirtualTable(instance);
            }
        }

        JavascriptOperators::OP_SetElementI(instance, aElementIndex, JavascriptNumber::ToVar(iValue, scriptContext), scriptContext, flags);
        return vt != VirtualTableInfoBase::GetVirtualTable(instance);
        JIT_HELPER_END(Op_SetNativeIntElementI);
    }